

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O2

void __thiscall
wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
scanLivenessThroughActions
          (LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this,
          vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions,
          SetOfLocals *live)

{
  int iVar1;
  pointer pLVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = ((long)(actions->
                 super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(actions->
                super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar4 = (uVar3 & 0xffffffff) * 0x18 + -0x14;
  for (; 0 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
    pLVar2 = (actions->
             super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>).
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)pLVar2 + lVar4 + -4);
    if (iVar1 == 0) {
      SortedVector::insert(live,*(Index *)((long)&pLVar2->what + lVar4));
    }
    else if (iVar1 == 1) {
      SortedVector::erase(live,*(Index *)((long)&pLVar2->what + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  }
  return;
}

Assistant:

void scanLivenessThroughActions(std::vector<LivenessAction>& actions,
                                  SetOfLocals& live) {
    // move towards the front
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      if (action.isGet()) {
        live.insert(action.index);
      } else if (action.isSet()) {
        live.erase(action.index);
      }
    }
  }